

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

char * process_pref_file_expr(char **sp,char *fp)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  char *local_48;
  char *t;
  char *p;
  byte *pbStack_30;
  char f;
  char *s;
  char *b;
  char *v;
  char *fp_local;
  char **sp_local;
  
  p._7_1_ = ' ';
  pbStack_30 = (byte *)*sp;
  v = fp;
  fp_local = (char *)sp;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*pbStack_30] & 0x2000) != 0) {
    pbStack_30 = pbStack_30 + 1;
  }
  s = (char *)pbStack_30;
  b = "?o?o?";
  if (*pbStack_30 == 0x5b) {
    pbStack_30 = pbStack_30 + 1;
    pcVar3 = process_pref_file_expr((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
    if (*pcVar3 != '\0') {
      iVar1 = strcmp(pcVar3,"IOR");
      if (iVar1 == 0) {
        b = "0";
        while (*pbStack_30 != 0 && p._7_1_ != ']') {
          pcVar3 = process_pref_file_expr((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
          if ((*pcVar3 != '\0') && (iVar1 = strcmp(pcVar3,"0"), iVar1 != 0)) {
            b = "1";
          }
        }
      }
      else {
        iVar1 = strcmp(pcVar3,"AND");
        if (iVar1 == 0) {
          b = "1";
          while (*pbStack_30 != 0 && p._7_1_ != ']') {
            pcVar3 = process_pref_file_expr
                               ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
            if ((*pcVar3 != '\0') && (iVar1 = strcmp(pcVar3,"0"), iVar1 == 0)) {
              b = "0";
            }
          }
        }
        else {
          iVar1 = strcmp(pcVar3,"NOT");
          if (iVar1 == 0) {
            b = "1";
            while (*pbStack_30 != 0 && p._7_1_ != ']') {
              pcVar3 = process_pref_file_expr
                                 ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
              if ((*pcVar3 != '\0') && (iVar1 = strcmp(pcVar3,"0"), iVar1 != 0)) {
                b = "0";
              }
            }
          }
          else {
            iVar1 = strcmp(pcVar3,"EQU");
            if (iVar1 == 0) {
              b = "1";
              if ((*pbStack_30 != 0) && (p._7_1_ != ']')) {
                pcVar3 = process_pref_file_expr
                                   ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
              }
              while (local_48 = pcVar3, *pbStack_30 != 0 && p._7_1_ != ']') {
                pcVar3 = process_pref_file_expr
                                   ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
                if ((*pcVar3 != '\0') && (iVar1 = strcmp(local_48,pcVar3), iVar1 != 0)) {
                  b = "0";
                }
              }
            }
            else {
              iVar1 = strcmp(pcVar3,"LEQ");
              if (iVar1 == 0) {
                b = "1";
                if ((*pbStack_30 != 0) && (p._7_1_ != ']')) {
                  pcVar3 = process_pref_file_expr
                                     ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
                }
                while (local_48 = pcVar3, *pbStack_30 != 0 && p._7_1_ != ']') {
                  pcVar3 = process_pref_file_expr
                                     ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
                  if ((*pcVar3 != '\0') && (iVar1 = strcmp(local_48,pcVar3), -1 < iVar1)) {
                    b = "0";
                  }
                }
              }
              else {
                iVar1 = strcmp(pcVar3,"GEQ");
                if (iVar1 == 0) {
                  b = "1";
                  if ((*pbStack_30 != 0) && (p._7_1_ != ']')) {
                    pcVar3 = process_pref_file_expr
                                       ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
                  }
                  while (local_48 = pcVar3, *pbStack_30 != 0 && p._7_1_ != ']') {
                    pcVar3 = process_pref_file_expr
                                       ((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7));
                    if ((*pcVar3 != '\0') && (iVar1 = strcmp(local_48,pcVar3), iVar1 < 1)) {
                      b = "0";
                    }
                  }
                }
                else {
                  while (*pbStack_30 != 0 && p._7_1_ != ']') {
                    process_pref_file_expr((char **)&stack0xffffffffffffffd0,(char *)((long)&p + 7))
                    ;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (p._7_1_ != ']') {
      b = "?x?x?";
    }
    p._7_1_ = *pbStack_30;
    if (p._7_1_ != 0) {
      *pbStack_30 = 0;
      pbStack_30 = pbStack_30 + 1;
    }
  }
  else {
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = false;
      if (((*ppuVar2)[(int)(uint)*pbStack_30] & 0x4000) != 0) {
        pcVar3 = strchr(" []",(int)(char)*pbStack_30);
        bVar4 = pcVar3 == (char *)0x0;
      }
      if (!bVar4) break;
      pbStack_30 = pbStack_30 + 1;
    }
    p._7_1_ = *pbStack_30;
    if (p._7_1_ != 0) {
      *pbStack_30 = 0;
      pbStack_30 = pbStack_30 + 1;
    }
    if (*s == '$') {
      iVar1 = strcmp(s + 1,"SYS");
      if (iVar1 == 0) {
        b = ANGBAND_SYS;
      }
      else {
        iVar1 = strcmp(s + 1,"RACE");
        if (iVar1 == 0) {
          b = player->race->name;
        }
        else {
          iVar1 = strcmp(s + 1,"CLASS");
          if (iVar1 == 0) {
            b = player->class->name;
          }
        }
      }
    }
    else {
      b = s;
    }
  }
  *v = p._7_1_;
  *(byte **)fp_local = pbStack_30;
  return b;
}

Assistant:

static const char *process_pref_file_expr(char **sp, char *fp)
{
	const char *v;

	char *b;
	char *s;

	char f = ' ';

	/* Initial */
	s = (*sp);

	/* Skip spaces */
	while (isspace((unsigned char)*s)) s++;

	/* Save start */
	b = s;

	/* Default */
	v = "?o?o?";

	/* Either the string starts with a [ or it doesn't */
	if (*s == '[') {
		const char *p;
		const char *t;

		/* Skip [ */
		s++;

		/* First */
		t = process_pref_file_expr(&s, &f);

		/* Check all the different types of connective */
		if (!*t) {
			/* Nothing */
		} else if (streq(t, "IOR")) {
			v = "0";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "1";
			}
		} else if (streq(t, "AND")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && streq(t, "0")) v = "0";
			}
		} else if (streq(t, "NOT")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "0";
			}
		} else if (streq(t, "EQU")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(p, t)) v = "0";
			}
		} else if (streq(t, "LEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) >= 0)) v = "0";
			}
		} else if (streq(t, "GEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) <= 0)) v = "0";
			}
		} else {
			while (*s && (f != ']')) {
				(void) process_pref_file_expr(&s, &f);
			}
		}

		/* Verify ending */
		if (f != ']') v = "?x?x?";

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';
	} else {
		/* Accept all printables except spaces and brackets */
		while (isprint((unsigned char)*s) && !strchr(" []", *s)) ++s;

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';

		/* Variables start with $, otherwise it's a constant */
		if (*b == '$') {
			if (streq(b+1, "SYS"))
				v = ANGBAND_SYS;
			else if (streq(b+1, "RACE"))
				v = player->race->name;
			else if (streq(b+1, "CLASS"))
				v = player->class->name;
		} else {
			v = b;
		}
	}

	/* Save */
	(*fp) = f;
	(*sp) = s;

	return v;
}